

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_elements_input_issuance_free(wally_tx_input *input)

{
  size_t len;
  
  if (input != (wally_tx_input *)0x0) {
    input->features = input->features & 0xfc;
    wally_clear(input->blinding_nonce,0x20);
    wally_clear(input->entropy,0x20);
    clear_and_free(input->issuance_amount,input->issuance_amount_len);
    input->issuance_amount = (uchar *)0x0;
    input->issuance_amount_len = 0;
    clear_and_free(input->inflation_keys,input->inflation_keys_len);
    input->inflation_keys = (uchar *)0x0;
    input->inflation_keys_len = 0;
    clear_and_free(input->issuance_amount_rangeproof,input->issuance_amount_rangeproof_len);
    input->issuance_amount_rangeproof = (uchar *)0x0;
    input->issuance_amount_rangeproof_len = 0;
    len = input->inflation_keys_rangeproof_len;
    clear_and_free(input->inflation_keys_rangeproof,len);
    input->inflation_keys_rangeproof = (uchar *)0x0;
    input->inflation_keys_rangeproof_len = 0;
    tx_witness_stack_free(input->pegin_witness,SUB81(len,0));
    input->pegin_witness = (wally_tx_witness_stack *)0x0;
  }
  return 0;
}

Assistant:

int wally_tx_elements_input_issuance_free(
    struct wally_tx_input *input)
{
    (void) input;
#ifdef BUILD_ELEMENTS
    if (input) {
        input->features &= ~(WALLY_TX_IS_ELEMENTS | WALLY_TX_IS_ISSUANCE);
        wally_clear(input->blinding_nonce, sizeof(input->blinding_nonce));
        wally_clear(input->entropy, sizeof(input->entropy));

#define FREE_PTR_AND_LEN(name) clear_and_free(input->name, input->name ## _len); \
    input->name = NULL; input->name ## _len = 0

        FREE_PTR_AND_LEN(issuance_amount);
        FREE_PTR_AND_LEN(inflation_keys);
        FREE_PTR_AND_LEN(issuance_amount_rangeproof);
        FREE_PTR_AND_LEN(inflation_keys_rangeproof);
#undef FREE_PTR_AND_LEN

        tx_witness_stack_free(input->pegin_witness, true);
        input->pegin_witness = NULL;
    }
#endif /* BUILD_ELEMENTS */
    return WALLY_OK;
}